

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O3

void bilinear_filter8xh(uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int h)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  short sVar19;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar20 [16];
  undefined1 auVar27 [16];
  short sVar34;
  short sVar35;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  short sVar51;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  auVar10 = _DAT_00516300;
  if (xoffset == 0) {
    if (-1 < h) {
      lVar8 = 0;
      do {
        *(undefined8 *)(dst + lVar8 * 8) = *(undefined8 *)src;
        src = src + src_stride;
        lVar8 = lVar8 + 1;
      } while (h + 1 != (int)lVar8);
    }
  }
  else if (xoffset == 4) {
    if (-1 < h) {
      lVar8 = 0;
      do {
        uVar11 = pavgb(src[1],*src);
        uVar12 = pavgb(src[2],src[1]);
        uVar13 = pavgb(src[3],src[2]);
        uVar14 = pavgb(src[4],src[3]);
        uVar15 = pavgb(src[5],src[4]);
        uVar16 = pavgb(src[6],src[5]);
        uVar17 = pavgb(src[7],src[6]);
        uVar18 = pavgb(src[8],src[7]);
        pavgb(src[9],src[8]);
        pavgb(src[10],src[9]);
        pavgb(src[0xb],src[10]);
        pavgb(src[0xc],src[0xb]);
        pavgb(src[0xd],src[0xc]);
        pavgb(src[0xe],src[0xd]);
        pavgb(src[0xf],src[0xe]);
        pavgb(0,src[0xf]);
        *(ulong *)(dst + lVar8 * 8) =
             CONCAT17(uVar18,CONCAT16(uVar17,CONCAT15(uVar16,CONCAT14(uVar15,CONCAT13(uVar14,
                                                  CONCAT12(uVar13,CONCAT11(uVar12,uVar11)))))));
        src = src + src_stride;
        lVar8 = lVar8 + 1;
      } while (h + 1 != (int)lVar8);
    }
  }
  else {
    auVar27 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[xoffset]),
                      ZEXT216((ushort)bilinear_filters_2t[xoffset]),0);
    auVar27._4_4_ = auVar27._0_4_;
    auVar27._8_4_ = auVar27._0_4_;
    auVar27._12_4_ = auVar27._0_4_;
    puVar5 = dst;
    if (0 < h) {
      iVar9 = 0;
      do {
        auVar36 = pshufb(*(undefined1 (*) [16])src,auVar10);
        auVar36 = pmaddubsw(auVar36,auVar27);
        sVar19 = pavgw(auVar36._0_2_ >> 6,0);
        sVar28 = pavgw(auVar36._2_2_ >> 6,0);
        sVar29 = pavgw(auVar36._4_2_ >> 6,0);
        sVar30 = pavgw(auVar36._6_2_ >> 6,0);
        sVar31 = pavgw(auVar36._8_2_ >> 6,0);
        sVar32 = pavgw(auVar36._10_2_ >> 6,0);
        sVar33 = pavgw(auVar36._12_2_ >> 6,0);
        sVar34 = pavgw(auVar36._14_2_ >> 6,0);
        auVar36 = pshufb(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + src_stride),auVar10);
        auVar36 = pmaddubsw(auVar36,auVar27);
        sVar35 = pavgw(auVar36._0_2_ >> 6,0);
        sVar45 = pavgw(auVar36._2_2_ >> 6,0);
        sVar46 = pavgw(auVar36._4_2_ >> 6,0);
        sVar47 = pavgw(auVar36._6_2_ >> 6,0);
        sVar48 = pavgw(auVar36._8_2_ >> 6,0);
        sVar49 = pavgw(auVar36._10_2_ >> 6,0);
        sVar50 = pavgw(auVar36._12_2_ >> 6,0);
        sVar51 = pavgw(auVar36._14_2_ >> 6,0);
        *puVar5 = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
        puVar5[1] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
        puVar5[2] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
        puVar5[3] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
        puVar5[4] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        puVar5[5] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        puVar5[6] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        puVar5[7] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        puVar5[8] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
        puVar5[9] = (0 < sVar45) * (sVar45 < 0x100) * (char)sVar45 - (0xff < sVar45);
        puVar5[10] = (0 < sVar46) * (sVar46 < 0x100) * (char)sVar46 - (0xff < sVar46);
        puVar5[0xb] = (0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47);
        puVar5[0xc] = (0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48);
        puVar5[0xd] = (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49);
        puVar5[0xe] = (0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 - (0xff < sVar50);
        puVar5[0xf] = (0 < sVar51) * (sVar51 < 0x100) * (char)sVar51 - (0xff < sVar51);
        src = *(undefined1 (*) [16])src + src_stride * 2;
        puVar5 = puVar5 + 0x10;
        iVar9 = iVar9 + 2;
      } while (iVar9 < h);
    }
    auVar10 = pshufb(*(undefined1 (*) [16])src,_DAT_00516300);
    auVar10 = pmaddubsw(auVar10,auVar27);
    sVar19 = pavgw(0,auVar10._0_2_ >> 6);
    sVar28 = pavgw(0,auVar10._2_2_ >> 6);
    sVar29 = pavgw(0,auVar10._4_2_ >> 6);
    sVar30 = pavgw(0,auVar10._6_2_ >> 6);
    sVar31 = pavgw(0,auVar10._8_2_ >> 6);
    sVar32 = pavgw(0,auVar10._10_2_ >> 6);
    sVar33 = pavgw(0,auVar10._12_2_ >> 6);
    sVar34 = pavgw(0,auVar10._14_2_ >> 6);
    *(ulong *)puVar5 =
         CONCAT17((0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34),
                  CONCAT16((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33),
                           CONCAT15((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32)
                                    ,CONCAT14((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 -
                                              (0xff < sVar31),
                                              CONCAT13((0 < sVar30) * (sVar30 < 0x100) *
                                                       (char)sVar30 - (0xff < sVar30),
                                                       CONCAT12((0 < sVar29) * (sVar29 < 0x100) *
                                                                (char)sVar29 - (0xff < sVar29),
                                                                CONCAT11((0 < sVar28) *
                                                                         (sVar28 < 0x100) *
                                                                         (char)sVar28 -
                                                                         (0xff < sVar28),
                                                                         (0 < sVar19) *
                                                                         (sVar19 < 0x100) *
                                                                         (char)sVar19 -
                                                                         (0xff < sVar19))))))));
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      if (0 < h) {
        lVar8 = 0;
        uVar6 = *(undefined8 *)dst;
        do {
          uVar3 = *(undefined8 *)(dst + lVar8 * 8 + 8);
          uVar1 = *(undefined8 *)(dst + lVar8 * 8 + 8);
          uVar11 = pavgb((char)uVar1,(char)uVar6);
          uVar12 = pavgb((char)((ulong)uVar1 >> 8),(char)((ulong)uVar6 >> 8));
          uVar13 = pavgb((char)((ulong)uVar1 >> 0x10),(char)((ulong)uVar6 >> 0x10));
          uVar14 = pavgb((char)((ulong)uVar1 >> 0x18),(char)((ulong)uVar6 >> 0x18));
          uVar15 = pavgb((char)((ulong)uVar1 >> 0x20),(char)((ulong)uVar6 >> 0x20));
          uVar16 = pavgb((char)((ulong)uVar1 >> 0x28),(char)((ulong)uVar6 >> 0x28));
          uVar17 = pavgb((char)((ulong)uVar1 >> 0x30),(char)((ulong)uVar6 >> 0x30));
          uVar18 = pavgb((char)((ulong)uVar1 >> 0x38),(char)((ulong)uVar6 >> 0x38));
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          *(ulong *)(dst + lVar8 * 8) =
               CONCAT17(uVar18,CONCAT16(uVar17,CONCAT15(uVar16,CONCAT14(uVar15,CONCAT13(uVar14,
                                                  CONCAT12(uVar13,CONCAT11(uVar12,uVar11)))))));
          lVar8 = lVar8 + 1;
          uVar6 = uVar3;
        } while (h != (int)lVar8);
      }
    }
    else if (0 < h) {
      auVar10 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[yoffset]),
                        ZEXT216((ushort)bilinear_filters_2t[yoffset]),0);
      auVar10._4_4_ = auVar10._0_4_;
      auVar10._8_4_ = auVar10._0_4_;
      auVar10._12_4_ = auVar10._0_4_;
      lVar8 = 0;
      uVar7 = *(ulong *)dst;
      do {
        uVar2 = *(ulong *)(dst + lVar8 * 8 + 8);
        uVar4 = *(ulong *)(dst + lVar8 * 8 + 0x10);
        uVar17 = (undefined1)(uVar2 >> 0x38);
        auVar26._8_6_ = 0;
        auVar26._0_8_ = uVar7;
        auVar26[0xe] = (char)(uVar7 >> 0x38);
        auVar26[0xf] = uVar17;
        auVar25._14_2_ = auVar26._14_2_;
        auVar25._8_5_ = 0;
        auVar25._0_8_ = uVar7;
        uVar16 = (undefined1)(uVar2 >> 0x30);
        auVar25[0xd] = uVar16;
        auVar24._13_3_ = auVar25._13_3_;
        auVar24._8_4_ = 0;
        auVar24._0_8_ = uVar7;
        auVar24[0xc] = (char)(uVar7 >> 0x30);
        auVar23._12_4_ = auVar24._12_4_;
        auVar23._8_3_ = 0;
        auVar23._0_8_ = uVar7;
        uVar15 = (undefined1)(uVar2 >> 0x28);
        auVar23[0xb] = uVar15;
        auVar22._11_5_ = auVar23._11_5_;
        auVar22._8_2_ = 0;
        auVar22._0_8_ = uVar7;
        auVar22[10] = (char)(uVar7 >> 0x28);
        auVar21._10_6_ = auVar22._10_6_;
        auVar21[8] = 0;
        auVar21._0_8_ = uVar7;
        uVar14 = (undefined1)(uVar2 >> 0x20);
        auVar21[9] = uVar14;
        auVar36._9_7_ = auVar21._9_7_;
        auVar36[8] = (char)(uVar7 >> 0x20);
        auVar36._0_8_ = uVar7;
        auVar20._8_8_ = auVar36._8_8_;
        uVar13 = (undefined1)(uVar2 >> 0x18);
        auVar20[7] = uVar13;
        auVar20[6] = (char)(uVar7 >> 0x18);
        uVar12 = (undefined1)(uVar2 >> 0x10);
        auVar20[5] = uVar12;
        auVar20[4] = (char)(uVar7 >> 0x10);
        uVar11 = (undefined1)(uVar2 >> 8);
        auVar20[3] = uVar11;
        auVar20[2] = (char)(uVar7 >> 8);
        auVar20[0] = (undefined1)uVar7;
        auVar37[0] = (undefined1)uVar2;
        auVar20[1] = auVar37[0];
        auVar27 = pmaddubsw(auVar20,auVar10);
        sVar19 = pavgw(auVar27._0_2_ >> 6,0);
        sVar28 = pavgw(auVar27._2_2_ >> 6,0);
        sVar29 = pavgw(auVar27._4_2_ >> 6,0);
        sVar30 = pavgw(auVar27._6_2_ >> 6,0);
        sVar31 = pavgw(auVar27._8_2_ >> 6,0);
        sVar32 = pavgw(auVar27._10_2_ >> 6,0);
        sVar33 = pavgw(auVar27._12_2_ >> 6,0);
        sVar34 = pavgw(auVar27._14_2_ >> 6,0);
        auVar44._8_6_ = 0;
        auVar44._0_8_ = uVar2;
        auVar44[0xe] = uVar17;
        auVar44[0xf] = (char)(uVar4 >> 0x38);
        auVar43._14_2_ = auVar44._14_2_;
        auVar43._8_5_ = 0;
        auVar43._0_8_ = uVar2;
        auVar43[0xd] = (char)(uVar4 >> 0x30);
        auVar42._13_3_ = auVar43._13_3_;
        auVar42._8_4_ = 0;
        auVar42._0_8_ = uVar2;
        auVar42[0xc] = uVar16;
        auVar41._12_4_ = auVar42._12_4_;
        auVar41._8_3_ = 0;
        auVar41._0_8_ = uVar2;
        auVar41[0xb] = (char)(uVar4 >> 0x28);
        auVar40._11_5_ = auVar41._11_5_;
        auVar40._8_2_ = 0;
        auVar40._0_8_ = uVar2;
        auVar40[10] = uVar15;
        auVar39._10_6_ = auVar40._10_6_;
        auVar39[8] = 0;
        auVar39._0_8_ = uVar2;
        auVar39[9] = (char)(uVar4 >> 0x20);
        auVar38._9_7_ = auVar39._9_7_;
        auVar38[8] = uVar14;
        auVar38._0_8_ = uVar2;
        auVar37._8_8_ = auVar38._8_8_;
        auVar37[7] = (char)(uVar4 >> 0x18);
        auVar37[6] = uVar13;
        auVar37[5] = (char)(uVar4 >> 0x10);
        auVar37[4] = uVar12;
        auVar37[3] = (char)(uVar4 >> 8);
        auVar37[2] = uVar11;
        auVar37[1] = (char)uVar4;
        auVar27 = pmaddubsw(auVar37,auVar10);
        sVar35 = pavgw(auVar27._0_2_ >> 6,0);
        sVar45 = pavgw(auVar27._2_2_ >> 6,0);
        sVar46 = pavgw(auVar27._4_2_ >> 6,0);
        sVar47 = pavgw(auVar27._6_2_ >> 6,0);
        sVar48 = pavgw(auVar27._8_2_ >> 6,0);
        sVar49 = pavgw(auVar27._10_2_ >> 6,0);
        sVar50 = pavgw(auVar27._12_2_ >> 6,0);
        sVar51 = pavgw(auVar27._14_2_ >> 6,0);
        puVar5 = dst + lVar8 * 8;
        *puVar5 = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
        puVar5[1] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
        puVar5[2] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
        puVar5[3] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
        puVar5[4] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        puVar5[5] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        puVar5[6] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        puVar5[7] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        puVar5[8] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
        puVar5[9] = (0 < sVar45) * (sVar45 < 0x100) * (char)sVar45 - (0xff < sVar45);
        puVar5[10] = (0 < sVar46) * (sVar46 < 0x100) * (char)sVar46 - (0xff < sVar46);
        puVar5[0xb] = (0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47);
        puVar5[0xc] = (0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48);
        puVar5[0xd] = (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49);
        puVar5[0xe] = (0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 - (0xff < sVar50);
        puVar5[0xf] = (0 < sVar51) * (sVar51 < 0x100) * (char)sVar51 - (0xff < sVar51);
        lVar8 = lVar8 + 2;
        uVar7 = uVar4;
      } while ((int)lVar8 < h);
    }
  }
  return;
}

Assistant:

static void bilinear_filter8xh(const uint8_t *src, int src_stride, int xoffset,
                               int yoffset, uint8_t *dst, int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      _mm_storel_epi64((__m128i *)b, x);
      src += src_stride;
      b += 8;
    }
  } else if (xoffset == 4) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadu_si128((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 1);
      _mm_storel_epi64((__m128i *)b, _mm_avg_epu8(x, z));
      src += src_stride;
      b += 8;
    }
  } else {
    uint8_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi16(hfilter[0] | (hfilter[1] << 8));
    for (i = 0; i < h; i += 2) {
      const __m128i x0 = _mm_loadu_si128((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 1);
      const __m128i x1 = _mm_loadu_si128((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 1);
      const __m128i res = filter_block_2rows(&x0, &z0, &x1, &z1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 2;
      b += 16;
    }
    // Handle i = h separately
    const __m128i x0 = _mm_loadu_si128((__m128i *)src);
    const __m128i z0 = _mm_srli_si128(x0, 1);

    __m128i v0 = _mm_unpacklo_epi8(x0, z0);
    v0 = _mm_maddubs_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu16(v0, FILTER_BITS);

    _mm_storel_epi64((__m128i *)b, _mm_packus_epi16(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)dst);
      __m128i y = _mm_loadl_epi64((__m128i *)&dst[8]);
      _mm_storel_epi64((__m128i *)dst, _mm_avg_epu8(x, y));
      dst += 8;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi16(vfilter[0] | (vfilter[1] << 8));
    for (i = 0; i < h; i += 2) {
      const __m128i x = _mm_loadl_epi64((__m128i *)dst);
      const __m128i y = _mm_loadl_epi64((__m128i *)&dst[8]);
      const __m128i z = _mm_loadl_epi64((__m128i *)&dst[16]);
      const __m128i res = filter_block_2rows(&x, &y, &y, &z, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 16;
    }
  }
}